

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_master_table_dictionary_create_delete
               (planck_unit_test_t *tc,ion_dictionary_size_t dictionary_size,
               ion_dictionary_type_t dictionary_type)

{
  MasterTable *this;
  Dictionary<int,_int> *dictionary;
  undefined4 in_register_00000034;
  MasterTable *pMVar1;
  
  pMVar1 = (MasterTable *)CONCAT44(in_register_00000034,dictionary_size);
  this = (MasterTable *)operator_new(0x50);
  ion_init_master_table();
  master_table_close(tc,pMVar1);
  remove("ion_mt.tbl");
  master_table_init(tc,pMVar1);
  pMVar1 = (MasterTable *)0x0;
  dictionary = MasterTable::initializeDictionary<int,int>
                         (this,key_type_numeric_signed,0,0,4,4,dictionary_size,dictionary_type);
  master_table_create_dictionary
            (tc,pMVar1,dictionary,1,key_type_numeric_signed,4,4,dictionary_size,dictionary_type);
  master_table_delete_dictionary(tc,this,dictionary);
  ion_delete_master_table();
  operator_delete(this);
  return;
}

Assistant:

void
test_master_table_dictionary_create_delete(
	planck_unit_test_t		*tc,
	ion_dictionary_size_t	dictionary_size,
	ion_dictionary_type_t	dictionary_type
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);

	Dictionary<int, int> *dictionary;

	int type = 0;

	dictionary = master_table->initializeDictionary(key_type_numeric_signed, type, type, sizeof(int), sizeof(int), dictionary_size, dictionary_type);
	master_table_create_dictionary(tc, master_table, dictionary, 1, key_type_numeric_signed, sizeof(int), sizeof(int), dictionary_size, dictionary_type);
	master_table_delete_dictionary(tc, master_table, dictionary);

	delete master_table;
}